

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimvcd.cpp
# Opt level: O3

void __thiscall ModuleTreeNode::~ModuleTreeNode(ModuleTreeNode *this)

{
  pointer ppMVar1;
  ModuleTreeNode *this_00;
  pointer pcVar2;
  pointer ppMVar3;
  
  ppMVar3 = (this->submodules).
            super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppMVar1 = (this->submodules).
            super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppMVar3 != ppMVar1) {
    do {
      this_00 = *ppMVar3;
      if (this_00 != (ModuleTreeNode *)0x0) {
        ~ModuleTreeNode(this_00);
      }
      operator_delete(this_00);
      ppMVar3 = ppMVar3 + 1;
    } while (ppMVar3 != ppMVar1);
    ppMVar3 = (this->submodules).
              super__Vector_base<ModuleTreeNode_*,_std::allocator<ModuleTreeNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppMVar3 != (pointer)0x0) {
    operator_delete(ppMVar3);
  }
  std::
  _Rb_tree<long,_std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::~_Rb_tree(&(this->wire_names)._M_t);
  pcVar2 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->name).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

ModuleTreeNode::~ModuleTreeNode ()
{
  for (ModuleTreeNode* m : submodules) delete m;
}